

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::InitializeFromPackedBuf
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_68 [8];
  string struct_type;
  string struct_var;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Variable_abi_cxx11_((string *)((long)&struct_type.field_2 + 8),&this->namer_,struct_def)
  ;
  IdlNamer::Type_abi_cxx11_((string *)local_68,&this->namer_,struct_def);
  GenIndents_abi_cxx11_(&local_b8,this,1);
  std::operator+(&local_98,&local_b8,"@classmethod");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  GenIndents_abi_cxx11_(&local_f8,this,1);
  std::operator+(&local_d8,&local_f8,"def InitFromPackedBuf(cls, buf, pos=0):");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  GenIndents_abi_cxx11_(&local_138,this,2);
  std::operator+(&local_118,&local_138,
                 "n = flatbuffers.encode.Get(flatbuffers.packer.uoffset, buf, pos)");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  GenIndents_abi_cxx11_(&local_178,this,2);
  std::operator+(&local_158,&local_178,"return cls.InitFromBuf(buf, pos+n)");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::operator+=((string *)code_ptr,"\n");
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(struct_type.field_2._M_local_buf + 8));
  return;
}

Assistant:

void InitializeFromPackedBuf(const StructDef &struct_def,
                               std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto struct_var = namer_.Variable(struct_def);
    const auto struct_type = namer_.Type(struct_def);

    code += GenIndents(1) + "@classmethod";
    code += GenIndents(1) + "def InitFromPackedBuf(cls, buf, pos=0):";
    code += GenIndents(2) +
            "n = flatbuffers.encode.Get(flatbuffers.packer.uoffset, buf, pos)";
    code += GenIndents(2) + "return cls.InitFromBuf(buf, pos+n)";
    code += "\n";
  }